

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool ExprEval::Operator::add_custom_operator(CustomOperator *custom_operator)

{
  bool bVar1;
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  local_f0 [3];
  type local_d8;
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  local_38;
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  local_30;
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  local_28;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *local_20;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *custom_table;
  CustomOperator *custom_operator_local;
  
  custom_table = (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                  *)custom_operator;
  local_20 = get_custom_table();
  local_30._M_current =
       (CustomOperator *)
       std::
       vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       ::cbegin(local_20);
  local_38._M_current =
       (CustomOperator *)
       std::
       vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       ::cend(local_20);
  std::
  bind<bool(&)(ExprEval::Operator::CustomOperator_const&,ExprEval::Operator::CustomOperator_const&),ExprEval::Operator::CustomOperator_const&,std::_Placeholder<1>const&>
            (&local_d8,equals,(CustomOperator *)custom_table,
             (_Placeholder<1> *)&std::placeholders::_1);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<ExprEval::Operator::CustomOperator_const*,std::vector<ExprEval::Operator::CustomOperator,std::allocator<ExprEval::Operator::CustomOperator>>>,std::_Bind<bool(*(ExprEval::Operator::CustomOperator,std::_Placeholder<1>))(ExprEval::Operator::CustomOperator_const&,ExprEval::Operator::CustomOperator_const&)>>
                       (local_30,local_38,&local_d8);
  local_f0[0]._M_current =
       (CustomOperator *)
       std::
       vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       ::cend(local_20);
  bVar1 = __gnu_cxx::operator==(&local_28,local_f0);
  std::
  _Bind<bool_(*(ExprEval::Operator::CustomOperator,_std::_Placeholder<1>))(const_ExprEval::Operator::CustomOperator_&,_const_ExprEval::Operator::CustomOperator_&)>
  ::~_Bind(&local_d8);
  if (bVar1) {
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,(value_type *)custom_table);
  }
  return bVar1;
}

Assistant:

bool add_custom_operator(const CustomOperator& custom_operator){
            auto custom_table = get_custom_table();
            if(std::find_if(custom_table->cbegin(), custom_table->cend(), std::bind(Operator::equals, custom_operator, std::placeholders::_1)) == custom_table->cend()){
                custom_operator_table->push_back(custom_operator);
                return true;
            }
            return false;
        }